

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

void __thiscall inja::Environment::Environment(Environment *this,path *input_path,path *output_path)

{
  path *output_path_local;
  path *input_path_local;
  Environment *this_local;
  
  FunctionStorage::FunctionStorage(&this->function_storage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
  ::map(&this->template_storage);
  LexerConfig::LexerConfig(&this->lexer_config);
  ParserConfig::ParserConfig(&this->parser_config);
  RenderConfig::RenderConfig(&this->render_config);
  std::filesystem::__cxx11::path::path(&this->input_path,input_path);
  std::filesystem::__cxx11::path::path(&this->output_path,output_path);
  return;
}

Assistant:

Environment(const std::filesystem::path& input_path, const std::filesystem::path& output_path): input_path(input_path), output_path(output_path) {}